

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli.c
# Opt level: O3

int decrypt_and_print(ptls_t *tls,uint8_t *input,size_t inlen)

{
  size_t sVar1;
  uint uVar2;
  int iVar3;
  size_t consumed;
  uint8_t decryptbuf_small [1024];
  size_t local_460;
  ptls_buffer_t local_458;
  uint8_t local_438 [1032];
  
  local_458.base = local_438;
  local_458.off = 0;
  local_458.capacity = 0x400;
  local_458.is_allocated = 0;
  if (inlen != 0) {
    do {
      local_460 = inlen;
      uVar2 = ptls_receive(tls,&local_458,input,&local_460);
      sVar1 = local_460;
      if (uVar2 != 0) {
        fprintf(_stderr,"ptls_receive:%d\n",(ulong)uVar2);
        return -1;
      }
      if (local_458.off != 0) {
        iVar3 = write_all(1,local_458.base,local_458.off);
        if (iVar3 != 0) {
          return -1;
        }
        local_458.off = 0;
      }
      input = input + sVar1;
      inlen = inlen - sVar1;
    } while (inlen != 0);
  }
  ptls_buffer__release_memory(&local_458);
  return 0;
}

Assistant:

static int decrypt_and_print(ptls_t *tls, const uint8_t *input, size_t inlen)
{
    ptls_buffer_t decryptbuf;
    uint8_t decryptbuf_small[1024];
    int ret;

    ptls_buffer_init(&decryptbuf, decryptbuf_small, sizeof(decryptbuf_small));

    while (inlen != 0) {
        size_t consumed = inlen;
        if ((ret = ptls_receive(tls, &decryptbuf, input, &consumed)) != 0) {
            fprintf(stderr, "ptls_receive:%d\n", ret);
            return -1;
        }
        input += consumed;
        inlen -= consumed;
        if (decryptbuf.off != 0) {
            if (write_all(1, decryptbuf.base, decryptbuf.off) != 0)
                return -1;
            decryptbuf.off = 0;
        }
    }

    ptls_buffer_dispose(&decryptbuf);
    return 0;
}